

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::CreateUtilityOutput
          (string *__return_storage_ptr__,cmLocalGenerator *this,string *targetName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_2,cmListFileBacktrace *param_3)

{
  string *a;
  cmSourceFile *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  cmSourceFile *local_40;
  cmSourceFile *sf;
  cmListFileBacktrace *local_30;
  cmListFileBacktrace *param_3_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *param_2_local;
  string *targetName_local;
  cmLocalGenerator *this_local;
  string *force;
  
  sf._7_1_ = 0;
  local_30 = param_3;
  param_3_local = (cmListFileBacktrace *)param_2;
  param_2_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)targetName;
  targetName_local = (string *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  a = GetCurrentBinaryDirectory_abi_cxx11_(this);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[13],std::__cxx11::string_const&>
            (__return_storage_ptr__,a,(char (*) [13])0x1031330,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_2_local);
  this_00 = cmMakefile::GetOrCreateGeneratedSource(this->Makefile,__return_storage_ptr__);
  local_40 = this_00;
  if (this_00 == (cmSourceFile *)0x0) {
    std::operator+(&local_c0,"Could not get source file entry for ",__return_storage_ptr__);
    cmSystemTools::Error(&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"SYMBOLIC",&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"1",&local_99);
    cmSourceFile::SetProperty(this_00,&local_70,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::CreateUtilityOutput(
  std::string const& targetName, std::vector<std::string> const&,
  cmListFileBacktrace const&)
{
  std::string force =
    cmStrCat(this->GetCurrentBinaryDirectory(), "/CMakeFiles/", targetName);
  // The output is not actually created so mark it symbolic.
  if (cmSourceFile* sf = this->Makefile->GetOrCreateGeneratedSource(force)) {
    sf->SetProperty("SYMBOLIC", "1");
  } else {
    cmSystemTools::Error("Could not get source file entry for " + force);
  }
  return force;
}